

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_2_5::anon_unknown_5::DefaultWorkerThread::run(DefaultWorkerThread *this)

{
  DefaultWorkData *pDVar1;
  pointer ppTVar2;
  Task *pTVar3;
  TaskGroup *pTVar4;
  void *in_RSI;
  Lock taskLock;
  Lock local_30;
  
  Semaphore::post(&this->_data->threadSemaphore);
  do {
    Semaphore::wait(&this->_data->taskSemaphore,in_RSI);
    local_30._mutex = &this->_data->taskMutex;
    local_30._locked = false;
    std::mutex::lock(local_30._mutex);
    local_30._locked = true;
    pDVar1 = this->_data;
    ppTVar2 = (pDVar1->tasks).
              super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pDVar1->tasks).
        super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppTVar2) {
      if (((pDVar1->stopping)._M_base._M_i & 1U) != 0) {
        Lock::~Lock(&local_30);
        return;
      }
    }
    else {
      pTVar3 = ppTVar2[-1];
      (pDVar1->tasks).
      super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar2 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)local_30._mutex);
      local_30._locked = false;
      pTVar4 = pTVar3->_group;
      (*pTVar3->_vptr_Task[2])(pTVar3);
      (*pTVar3->_vptr_Task[1])(pTVar3);
      TaskGroup::Data::removeTask(pTVar4->_data);
    }
    Lock::~Lock(&local_30);
  } while( true );
}

Assistant:

void
DefaultWorkerThread::run ()
{
    //
    // Signal that the thread has started executing
    //

    _data->threadSemaphore.post();

    while (true)
    {
        //
        // Wait for a task to become available
        //

        _data->taskSemaphore.wait();

        {
            Lock taskLock (_data->taskMutex);
    
            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!_data->tasks.empty())
            {
                Task* task = _data->tasks.back();
                _data->tasks.pop_back();
                taskLock.release();

                TaskGroup* taskGroup = task->group();
                task->execute();

                delete task;

                taskGroup->_data->removeTask ();
            }
            else if (_data->stopped())
            {
                break;
            }
        }
    }
}